

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pseudo-dt-finder.hpp
# Opt level: O2

void __thiscall
yactfr::internal::PseudoDtFinder<yactfr::internal::PseudoDtVisitor>::visit
          (PseudoDtFinder<yactfr::internal::PseudoDtVisitor> *this,
          _tPseudoDt<PseudoStructType> *pseudoDt)

{
  pointer puVar1;
  PseudoNamedDt *pPVar2;
  __uniq_ptr_data<yactfr::internal::PseudoDt,_std::default_delete<yactfr::internal::PseudoDt>,_true,_true>
  _Var3;
  reference_const_type pbVar4;
  pointer puVar5;
  
  _tryAdd(this,&pseudoDt->super_PseudoDt);
  puVar5 = (pseudoDt->_pseudoMemberTypes).
           super__Vector_base<std::unique_ptr<yactfr::internal::PseudoNamedDt,_std::default_delete<yactfr::internal::PseudoNamedDt>_>,_std::allocator<std::unique_ptr<yactfr::internal::PseudoNamedDt,_std::default_delete<yactfr::internal::PseudoNamedDt>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (pseudoDt->_pseudoMemberTypes).
           super__Vector_base<std::unique_ptr<yactfr::internal::PseudoNamedDt,_std::default_delete<yactfr::internal::PseudoNamedDt>_>,_std::allocator<std::unique_ptr<yactfr::internal::PseudoNamedDt,_std::default_delete<yactfr::internal::PseudoNamedDt>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (puVar5 == puVar1) {
      return;
    }
    pPVar2 = (puVar5->_M_t).
             super___uniq_ptr_impl<yactfr::internal::PseudoNamedDt,_std::default_delete<yactfr::internal::PseudoNamedDt>_>
             ._M_t.
             super__Tuple_impl<0UL,_yactfr::internal::PseudoNamedDt_*,_std::default_delete<yactfr::internal::PseudoNamedDt>_>
             .super__Head_base<0UL,_yactfr::internal::PseudoNamedDt_*,_false>._M_head_impl;
    if ((pPVar2->_name).super_type.m_initialized == false) break;
    pbVar4 = boost::
             optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::get(&pPVar2->_name);
    this->_curMemberTypeName = pbVar4;
    _Var3.
    super___uniq_ptr_impl<yactfr::internal::PseudoDt,_std::default_delete<yactfr::internal::PseudoDt>_>
    ._M_t.
    super__Tuple_impl<0UL,_yactfr::internal::PseudoDt_*,_std::default_delete<yactfr::internal::PseudoDt>_>
    .super__Head_base<0UL,_yactfr::internal::PseudoDt_*,_false>._M_head_impl =
         (((puVar5->_M_t).
           super___uniq_ptr_impl<yactfr::internal::PseudoNamedDt,_std::default_delete<yactfr::internal::PseudoNamedDt>_>
           ._M_t.
           super__Tuple_impl<0UL,_yactfr::internal::PseudoNamedDt_*,_std::default_delete<yactfr::internal::PseudoNamedDt>_>
           .super__Head_base<0UL,_yactfr::internal::PseudoNamedDt_*,_false>._M_head_impl)->_pseudoDt
         )._M_t.
         super___uniq_ptr_impl<yactfr::internal::PseudoDt,_std::default_delete<yactfr::internal::PseudoDt>_>
    ;
    (**(code **)(*(long *)_Var3.
                          super___uniq_ptr_impl<yactfr::internal::PseudoDt,_std::default_delete<yactfr::internal::PseudoDt>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_yactfr::internal::PseudoDt_*,_std::default_delete<yactfr::internal::PseudoDt>_>
                          .super__Head_base<0UL,_yactfr::internal::PseudoDt_*,_false>._M_head_impl +
                0x20))(_Var3.
                       super___uniq_ptr_impl<yactfr::internal::PseudoDt,_std::default_delete<yactfr::internal::PseudoDt>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_yactfr::internal::PseudoDt_*,_std::default_delete<yactfr::internal::PseudoDt>_>
                       .super__Head_base<0UL,_yactfr::internal::PseudoDt_*,_false>._M_head_impl,this
                      );
    puVar5 = puVar5 + 1;
  }
  __assert_fail("pseudoMemberType->name()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/eepp[P]yactfr/yactfr/internal/metadata/tsdl/../pseudo-dt-finder.hpp"
                ,0x4d,
                "virtual void yactfr::internal::PseudoDtFinder<yactfr::internal::PseudoDtVisitor>::visit(_tPseudoDt<PseudoStructType> &) [ParentVisitorT = yactfr::internal::PseudoDtVisitor]"
               );
}

Assistant:

void visit(_tPseudoDt<PseudoStructType>& pseudoDt) override
    {
        this->_tryAdd(pseudoDt);

        for (const auto& pseudoMemberType : pseudoDt.pseudoMemberTypes()) {
            assert(pseudoMemberType->name());
            _curMemberTypeName = &(*pseudoMemberType->name());
            pseudoMemberType->pseudoDt().accept(*this);
        }
    }